

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::
emplace<QWindowSystemInterface::TouchPoint_const&>
          (QGenericArrayOps<QWindowSystemInterface::TouchPoint> *this,qsizetype i,TouchPoint *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> *in_RSI;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  TouchPoint tmp;
  TouchPoint *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff14;
  byte bVar6;
  GrowthPosition where;
  Inserter local_d0;
  undefined1 local_80 [120];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::needsDetach
                    ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)
                     CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::freeSpaceAtEnd(in_RDI),
       qVar3 != 0)) {
      QArrayDataPointer<QWindowSystemInterface::TouchPoint>::end
                ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      QWindowSystemInterface::TouchPoint::TouchPoint
                ((TouchPoint *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00157724;
    }
    if ((in_RSI == (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x0) &&
       (qVar3 = QArrayDataPointer<QWindowSystemInterface::TouchPoint>::freeSpaceAtBegin(in_RDI),
       qVar3 != 0)) {
      QArrayDataPointer<QWindowSystemInterface::TouchPoint>::begin
                ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x1575ea);
      QWindowSystemInterface::TouchPoint::TouchPoint
                ((TouchPoint *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00157724;
    }
  }
  memcpy(local_80,&DAT_0016afc8,0x78);
  QWindowSystemInterface::TouchPoint::TouchPoint
            ((TouchPoint *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QWindowSystemInterface::TouchPoint>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff14,uVar2))),
             (TouchPoint **)in_RDI,
             (QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)
             CONCAT17(uVar5,in_stack_ffffffffffffff00));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_d0,in_RDI);
    Inserter::insertOne((Inserter *)
                        CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff14,uVar2))),
                        (qsizetype)in_RDI,(TouchPoint *)CONCAT17(uVar5,in_stack_ffffffffffffff00));
    Inserter::~Inserter(&local_d0);
  }
  else {
    QArrayDataPointer<QWindowSystemInterface::TouchPoint>::begin
              ((QArrayDataPointer<QWindowSystemInterface::TouchPoint> *)0x1576b4);
    QWindowSystemInterface::TouchPoint::TouchPoint
              ((TouchPoint *)CONCAT17(uVar5,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QWindowSystemInterface::TouchPoint::~TouchPoint((TouchPoint *)0x157724);
LAB_00157724:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }